

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.h
# Opt level: O1

void __thiscall
basisu::basis_compressor_params::~basis_compressor_params(basis_compressor_params *this)

{
  uint uVar1;
  key_value *pkVar2;
  void *pvVar3;
  pointer pcVar4;
  image *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long lVar7;
  vector<basisu::image> *pvVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  vector<basisu::image> *pvVar11;
  
  pkVar2 = (this->m_ktx2_key_values).m_p;
  if (pkVar2 != (key_value *)0x0) {
    uVar10 = (ulong)(this->m_ktx2_key_values).m_size;
    if (uVar10 != 0) {
      lVar7 = 0;
      do {
        pvVar3 = *(void **)((long)&(pkVar2->m_value).m_p + lVar7);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
        }
        pvVar3 = *(void **)((long)&(pkVar2->m_key).m_p + lVar7);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
        }
        lVar7 = lVar7 + 0x20;
      } while (uVar10 << 5 != lVar7);
    }
    free((this->m_ktx2_key_values).m_p);
  }
  pcVar4 = (this->m_mip_filter)._M_dataplus._M_p;
  paVar9 = &(this->m_mip_filter).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar9) {
    operator_delete(pcVar4,paVar9->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->m_out_filename)._M_dataplus._M_p;
  paVar9 = &(this->m_out_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar9) {
    operator_delete(pcVar4,paVar9->_M_allocated_capacity + 1);
  }
  pvVar8 = (this->m_source_mipmap_images).m_p;
  if (pvVar8 != (vector<basisu::image> *)0x0) {
    uVar10 = (ulong)(this->m_source_mipmap_images).m_size;
    if (uVar10 != 0) {
      pvVar11 = pvVar8 + uVar10;
      do {
        piVar5 = pvVar8->m_p;
        if (piVar5 != (image *)0x0) {
          uVar1 = pvVar8->m_size;
          if ((ulong)uVar1 != 0) {
            lVar7 = 0;
            do {
              pvVar3 = *(void **)((long)&(piVar5->m_pixels).m_p + lVar7);
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
              lVar7 = lVar7 + 0x20;
            } while ((ulong)uVar1 << 5 != lVar7);
          }
          free(pvVar8->m_p);
        }
        pvVar8 = pvVar8 + 1;
      } while (pvVar8 != pvVar11);
    }
    free((this->m_source_mipmap_images).m_p);
  }
  piVar5 = (this->m_source_images).m_p;
  if (piVar5 != (image *)0x0) {
    uVar10 = (ulong)(this->m_source_images).m_size;
    if (uVar10 != 0) {
      lVar7 = 0;
      do {
        pvVar3 = *(void **)((long)&(piVar5->m_pixels).m_p + lVar7);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
        }
        lVar7 = lVar7 + 0x20;
      } while (uVar10 << 5 != lVar7);
    }
    free((this->m_source_images).m_p);
  }
  pbVar6 = (this->m_source_alpha_filenames).m_p;
  if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    uVar10 = (ulong)(this->m_source_alpha_filenames).m_size;
    if (uVar10 != 0) {
      lVar7 = uVar10 << 5;
      paVar9 = &pbVar6->field_2;
      do {
        if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar9->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar9->_M_allocated_capacity)[-2],
                          paVar9->_M_allocated_capacity + 1);
        }
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar9->_M_allocated_capacity + 4);
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != 0);
    }
    free((this->m_source_alpha_filenames).m_p);
  }
  pbVar6 = (this->m_source_filenames).m_p;
  if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    uVar10 = (ulong)(this->m_source_filenames).m_size;
    if (uVar10 != 0) {
      lVar7 = uVar10 << 5;
      paVar9 = &pbVar6->field_2;
      do {
        if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar9->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar9->_M_allocated_capacity)[-2],
                          paVar9->_M_allocated_capacity + 1);
        }
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar9->_M_allocated_capacity + 4);
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != 0);
    }
    free((this->m_source_filenames).m_p);
    return;
  }
  return;
}

Assistant:

basis_compressor_params() :
			m_compression_level((int)BASISU_DEFAULT_COMPRESSION_LEVEL, 0, (int)BASISU_MAX_COMPRESSION_LEVEL),
			m_selector_rdo_thresh(BASISU_DEFAULT_SELECTOR_RDO_THRESH, 0.0f, 1e+10f),
			m_endpoint_rdo_thresh(BASISU_DEFAULT_ENDPOINT_RDO_THRESH, 0.0f, 1e+10f),
			m_mip_scale(1.0f, .000125f, 4.0f),
			m_mip_smallest_dimension(1, 1, 16384),
			m_max_endpoint_clusters(512),
			m_max_selector_clusters(512),
			m_quality_level(-1),
			m_pack_uastc_flags(cPackUASTCLevelDefault),
			m_rdo_uastc_quality_scalar(1.0f, 0.001f, 50.0f),
			m_rdo_uastc_dict_size(BASISU_RDO_UASTC_DICT_SIZE_DEFAULT, BASISU_RDO_UASTC_DICT_SIZE_MIN, BASISU_RDO_UASTC_DICT_SIZE_MAX),
			m_rdo_uastc_max_smooth_block_error_scale(UASTC_RDO_DEFAULT_SMOOTH_BLOCK_MAX_ERROR_SCALE, 1.0f, 300.0f),
			m_rdo_uastc_smooth_block_max_std_dev(UASTC_RDO_DEFAULT_MAX_SMOOTH_BLOCK_STD_DEV, .01f, 65536.0f),
			m_rdo_uastc_max_allowed_rms_increase_ratio(UASTC_RDO_DEFAULT_MAX_ALLOWED_RMS_INCREASE_RATIO, .01f, 100.0f),
			m_rdo_uastc_skip_block_rms_thresh(UASTC_RDO_DEFAULT_SKIP_BLOCK_RMS_THRESH, .01f, 100.0f),
			m_resample_width(0, 1, 16384),
			m_resample_height(0, 1, 16384),
			m_resample_factor(0.0f, .00125f, 100.0f),
			m_ktx2_uastc_supercompression(basist::KTX2_SS_NONE),
			m_ktx2_zstd_supercompression_level(6, INT_MIN, INT_MAX),
			m_pJob_pool(nullptr)
		{
			clear();
		}